

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.hpp
# Opt level: O2

ProxyWithLink * __thiscall
diy::Master::proxy(ProxyWithLink *__return_storage_ptr__,Master *this,int i,IExchangeInfo *iex)

{
  void *pvVar1;
  Link *pLVar2;
  Proxy local_b0;
  
  Proxy::Proxy(&local_b0,this,
               (this->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[i],iex);
  pvVar1 = (this->blocks_).elements_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
           super__Vector_impl_data._M_start[i];
  pLVar2 = (this->links_).super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
           super__Vector_impl_data._M_start[i];
  Proxy::Proxy(&__return_storage_ptr__->super_Proxy,&local_b0);
  __return_storage_ptr__->block_ = pvVar1;
  __return_storage_ptr__->link_ = pLVar2;
  Proxy::~Proxy(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

int
diy::Master::
add(int gid__, void* b, Link* l)
{
  if (*blocks_.in_memory().const_access() == limit_)
    unload_all();

  lock_guard<fast_mutex>    lock(add_mutex_);       // allow to add blocks from multiple threads

  blocks_.add(b);
  links_.push_back(l);
  gids_.push_back(gid__);

  int lid__ = static_cast<int>(gids_.size()) - 1;
  lids_[gid__] = lid__;
  add_expected(l->size_unique()); // NB: at every iteration we expect a message from each unique neighbor

  return lid__;
}